

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage;
  AActor *missile;
  bool bVar1;
  AActor *target;
  char *pcVar2;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0041eb70;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041eb57:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041eb70:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12cb,
                  "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_0041eade;
    bVar1 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041eb70;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_0041eb57;
LAB_0041eade:
    target = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if ((uint)numparam < 3) {
        pcVar2 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x03') {
          damage = param[1].field_0.i;
          missile = (AActor *)param[2].field_0.field_1.a;
          if (param[2].field_0.field_1.atag == 1) {
            if (missile != (AActor *)0x0) {
              bVar1 = DObject::IsKindOf((DObject *)missile,AActor::RegistrationInfo.MyClass);
              if (bVar1) {
                P_TraceBleed(damage,target,missile);
                return 0;
              }
              pcVar2 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0041ebc0;
            }
LAB_0041eb46:
            P_TraceBleed(damage,target);
            return 0;
          }
          if (missile == (AActor *)0x0) goto LAB_0041eb46;
        }
        pcVar2 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0041ebc0:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x12cd,
                    "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar2 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x12cc,
                "int AF_AActor_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TraceBleed)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(damage);
	PARAM_OBJECT(missile, AActor);

	if (missile) P_TraceBleed(damage, self, missile);
	else P_TraceBleed(damage, self);
	return 0;
}